

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O1

void __thiscall
gss::innards::Proof::create_clique_encoding
          (Proof *this,vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *enc,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
          *zero_in_proof_objectives)

{
  undefined1 auVar1 [16];
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var2;
  pointer ppVar3;
  mapped_type *__args_1;
  _Rb_tree_node_base *p_Var4;
  ulong uVar5;
  uint local_4c;
  key_type local_48;
  
  ((this->_imp)._M_t.
   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>.
   _M_t.
   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->clique_encoding = true;
  local_4c = 0;
  ppVar3 = (enc->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((enc->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppVar3) {
    uVar5 = 0;
    do {
      _Var2._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      auVar1._8_8_ = 0;
      auVar1._0_4_ = ppVar3[uVar5].first;
      auVar1._4_4_ = ppVar3[uVar5].second;
      local_48 = (key_type)vpmovsxdq_avx(auVar1);
      __args_1 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&(_Var2._M_head_impl)->variable_mappings,&local_48);
      std::
      _Rb_tree<long,std::pair<long_const,std::__cxx11::string>,std::_Select1st<std::pair<long_const,std::__cxx11::string>>,std::less<long>,std::allocator<std::pair<long_const,std::__cxx11::string>>>
      ::_M_emplace_unique<unsigned_int&,std::__cxx11::string&>
                ((_Rb_tree<long,std::pair<long_const,std::__cxx11::string>,std::_Select1st<std::pair<long_const,std::__cxx11::string>>,std::less<long>,std::allocator<std::pair<long_const,std::__cxx11::string>>>
                  *)&(_Var2._M_head_impl)->binary_variable_mappings,&local_4c,__args_1);
      local_4c = local_4c + 1;
      uVar5 = (ulong)local_4c;
      ppVar3 = (enc->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(enc->
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 3))
    ;
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
            (&((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
              zero_in_proof_objectives,zero_in_proof_objectives);
  _Var2._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  (_Var2._M_head_impl)->doing_mcs_by_clique = true;
  if ((_Var2._M_head_impl)->recover_encoding != false) {
    for (p_Var4 = *(_Base_ptr *)((long)&(_Var2._M_head_impl)->at_least_one_value_constraints + 0x18)
        ; p_Var4 != (_Rb_tree_node_base *)
                    ((long)&(_Var2._M_head_impl)->at_least_one_value_constraints + 8U);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      recover_at_least_one_constraint(this,p_Var4[1]._M_color);
    }
  }
  return;
}

Assistant:

auto Proof::create_clique_encoding(
    const vector<pair<int, int>> & enc,
    const vector<pair<int, int>> & zero_in_proof_objectives) -> void
{
    _imp->clique_encoding = true;
    for (unsigned i = 0; i < enc.size(); ++i)
        _imp->binary_variable_mappings.emplace(i, _imp->variable_mappings[enc[i]]);

    _imp->zero_in_proof_objectives = zero_in_proof_objectives;
    _imp->doing_mcs_by_clique = true;

    if (_imp->recover_encoding)
        for (auto & [k, _] : _imp->at_least_one_value_constraints)
            recover_at_least_one_constraint(k);
}